

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

int_type __thiscall
nlohmann::detail::input_stream_adapter::get_character(input_stream_adapter *this)

{
  byte bVar1;
  streambuf *psVar2;
  byte *pbVar3;
  int_type iVar4;
  
  psVar2 = this->sb;
  pbVar3 = *(byte **)(psVar2 + 0x10);
  if (pbVar3 < *(byte **)(psVar2 + 0x18)) {
    bVar1 = *pbVar3;
    *(byte **)(psVar2 + 0x10) = pbVar3 + 1;
    return (int_type)bVar1;
  }
  iVar4 = (**(code **)(*(long *)psVar2 + 0x50))();
  return iVar4;
}

Assistant:

std::char_traits<char>::int_type get_character() override
    {
        return sb.sbumpc();
    }